

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.h
# Opt level: O0

void __thiscall
ccs::SearchState::cacheProperty
          (SearchState *this,string *propertyName,Specificity spec,Property *property)

{
  bool bVar1;
  element_type *this_00;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_PropertySetting>_>::value,_pair<iterator,_bool>_>
  _Var3;
  PropertySetting *local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
  local_180;
  _Self local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
  local_108;
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined4 local_98;
  PropertySetting *local_88;
  PropertySetting *parentProperty;
  Specificity local_78;
  undefined1 local_70 [8];
  PropertySetting newSetting;
  iterator it;
  Property *property_local;
  string *propertyName_local;
  SearchState *this_local;
  Specificity spec_local;
  
  it._M_node = (_Base_ptr)property;
  newSetting.values._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
               ::find(&this->properties,propertyName);
  local_78 = spec;
  PropertySetting::PropertySetting((PropertySetting *)local_70,spec,(Property *)it._M_node);
  parentProperty =
       (PropertySetting *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
       ::end(&this->properties);
  bVar1 = std::operator==((_Self *)&newSetting.values._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,(_Self *)&parentProperty);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->parent);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->parent);
      local_1b8 = checkCache(this_00,propertyName);
    }
    else {
      local_1b8 = (PropertySetting *)0x0;
    }
    local_88 = local_1b8;
    if (local_1b8 != (PropertySetting *)0x0) {
      bVar1 = PropertySetting::better(local_1b8,(PropertySetting *)local_70);
      if (bVar1) {
        local_98 = 1;
        goto LAB_001d7953;
      }
      std::make_pair<std::__cxx11::string_const&,ccs::PropertySetting_const&>
                (&local_108,propertyName,local_88);
      _Var3 = std::
              map<std::__cxx11::string,ccs::PropertySetting,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
              ::insert<std::pair<std::__cxx11::string,ccs::PropertySetting>>
                        ((map<std::__cxx11::string,ccs::PropertySetting,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                          *)&this->properties,&local_108);
      local_118 = (_Base_ptr)_Var3.first._M_node;
      local_110 = _Var3.second;
      local_a8 = local_118;
      local_a0 = local_110;
      newSetting.values._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_118;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
      ::~pair(&local_108);
    }
  }
  local_120._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
       ::end(&this->properties);
  bVar1 = std::operator==((_Self *)&newSetting.values._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,&local_120);
  if (bVar1) {
    std::make_pair<std::__cxx11::string_const&,ccs::PropertySetting&>
              (&local_180,propertyName,(PropertySetting *)local_70);
    std::
    map<std::__cxx11::string,ccs::PropertySetting,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
    ::insert<std::pair<std::__cxx11::string,ccs::PropertySetting>>
              ((map<std::__cxx11::string,ccs::PropertySetting,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccs::PropertySetting>>>
                *)&this->properties,&local_180);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>
    ::~pair(&local_180);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
                           *)&newSetting.values._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = PropertySetting::better((PropertySetting *)local_70,&ppVar2->second);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
                             *)&newSetting.values._M_t._M_impl.super__Rb_tree_header._M_node_count);
      PropertySetting::operator=(&ppVar2->second,(PropertySetting *)local_70);
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
                             *)&newSetting.values._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = PropertySetting::better(&ppVar2->second,(PropertySetting *)local_70);
      if (!bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
                               *)&newSetting.values._M_t._M_impl.super__Rb_tree_header._M_node_count
                             );
        std::
        set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
        ::insert(&(ppVar2->second).values,(value_type *)&it);
      }
    }
  }
  local_98 = 0;
LAB_001d7953:
  PropertySetting::~PropertySetting((PropertySetting *)local_70);
  return;
}

Assistant:

void cacheProperty(const std::string &propertyName,
      Specificity spec, const Property *property) {
    auto it = properties.find(propertyName);

    PropertySetting newSetting(spec, property);

    if (it == properties.end()) {
      // we don't have a local setting for this yet.
      auto parentProperty = parent ? parent->checkCache(propertyName) : nullptr;
      if (parentProperty) {
        if (parentProperty->better(newSetting))
          // parent copy found, parent property better, leave local cache empty.
          return;

        // copy parent property into local cache. this is done solely to
        // support conflict detection.
        it = properties.insert(std::make_pair(propertyName, *parentProperty))
            .first;
      }
    }

    if (it == properties.end()) {
      properties.insert(std::make_pair(propertyName, newSetting));
    } else if (newSetting.better(it->second)) {
      // new property better than local cache. replace.
      it->second = newSetting;
    } else if (it->second.better(newSetting)) {
      // ignore
    } else {
      // new property has same specificity/override as existing... append.
      it->second.values.insert(property);
    }
  }